

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O0

void __thiscall dgrminer::PartialUnion::performSimpleTimeAbstraction(PartialUnion *this)

{
  int iVar1;
  value_type vVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  ulong local_20;
  size_t i_1;
  size_t i;
  PartialUnion *this_local;
  
  for (i_1 = 0; sVar3 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::
                        size(&this->nodes), i_1 < sVar3; i_1 = i_1 + 1) {
    pvVar4 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::operator[]
                       (&this->nodes,i_1);
    pvVar5 = std::array<int,_6UL>::operator[](pvVar4,4);
    if (*pvVar5 < 0) {
      pvVar4 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::operator[]
                         (&this->nodes,i_1);
      pvVar5 = std::array<int,_6UL>::operator[](pvVar4,4);
      *pvVar5 = -1;
    }
    else {
      pvVar4 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::operator[]
                         (&this->nodes,i_1);
      pvVar5 = std::array<int,_6UL>::operator[](pvVar4,4);
      if (0 < *pvVar5) {
        pvVar4 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::
                 operator[](&this->nodes,i_1);
        pvVar5 = std::array<int,_6UL>::operator[](pvVar4,4);
        *pvVar5 = 1;
      }
    }
    pvVar4 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::operator[]
                       (&this->nodes,i_1);
    pvVar5 = std::array<int,_6UL>::operator[](pvVar4,5);
    iVar1 = *pvVar5;
    pvVar4 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::operator[]
                       (&this->nodes,i_1);
    pvVar5 = std::array<int,_6UL>::operator[](pvVar4,0);
    vVar2 = -1;
    if (iVar1 == *pvVar5) {
      vVar2 = 0;
    }
    pvVar4 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::operator[]
                       (&this->nodes,i_1);
    pvVar5 = std::array<int,_6UL>::operator[](pvVar4,5);
    *pvVar5 = vVar2;
  }
  for (local_20 = 0;
      sVar3 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::size
                        (&this->edges), local_20 < sVar3; local_20 = local_20 + 1) {
    pvVar6 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                       (&this->edges,local_20);
    pvVar7 = std::array<int,_8UL>::operator[](pvVar6,6);
    if (*pvVar7 < 0) {
      pvVar6 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                         (&this->edges,local_20);
      pvVar7 = std::array<int,_8UL>::operator[](pvVar6,6);
      *pvVar7 = -1;
    }
    else {
      pvVar6 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                         (&this->edges,local_20);
      pvVar7 = std::array<int,_8UL>::operator[](pvVar6,6);
      if (0 < *pvVar7) {
        pvVar6 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
                 operator[](&this->edges,local_20);
        pvVar7 = std::array<int,_8UL>::operator[](pvVar6,6);
        *pvVar7 = 1;
      }
    }
  }
  return;
}

Assistant:

void PartialUnion::performSimpleTimeAbstraction()
	{
		for (size_t i = 0; i < nodes.size(); i++)
		{
			if (nodes[i][PN_CHANGETIME] < 0)
			{
				nodes[i][PN_CHANGETIME] = -1;
			}
			else if (nodes[i][PN_CHANGETIME] > 0)
			{
				nodes[i][PN_CHANGETIME] = 1;
			}
			nodes[i][PN_CHANGETIMELINK] = (nodes[i][PN_CHANGETIMELINK] == nodes[i][PN_TIME]) ? 0 : -1;
		}

		for (size_t i = 0; i < edges.size(); i++)
		{
			if (edges[i][PE_CHANGETIME] < 0)
			{
				edges[i][PE_CHANGETIME] = -1;
			}
			else if (edges[i][PE_CHANGETIME] > 0)
			{
				edges[i][PE_CHANGETIME] = 1;
			}
		}

	}